

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test::
TestBody(UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  string_view data;
  AssertHelper local_450;
  AssertionResult gtest_ar;
  string local_438;
  AssertionResult gtest_ar_;
  string bizarro_data;
  TestEmptyMessage empty_message;
  ArrayInputStream raw_input;
  CodedInputStream input;
  TestAllTypes all_types_message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&all_types_message);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&empty_message);
  UnknownFieldSetTest::GetBizarroData_abi_cxx11_(&bizarro_data,&this->super_UnknownFieldSetTest);
  io::ArrayInputStream::ArrayInputStream
            (&raw_input,bizarro_data._M_dataplus._M_p,(int)bizarro_data._M_string_length,-1);
  io::CodedInputStream::CodedInputStream(&input,&raw_input.super_ZeroCopyInputStream);
  gtest_ar_.success_ =
       internal::WireFormat::ParseAndMergePartial(&input,&all_types_message.super_Message);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    data._M_len._4_4_ = bizarro_data._M_string_length._4_4_;
    data._M_len._0_4_ = (int)bizarro_data._M_string_length;
    data._M_str = bizarro_data._M_dataplus._M_p;
    gtest_ar_.success_ = MessageLite::ParseFromString((MessageLite *)&empty_message,data);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      Message::DebugString_abi_cxx11_(&local_438,(Message *)&empty_message);
      Message::DebugString_abi_cxx11_((string *)&gtest_ar_,&all_types_message.super_Message);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"empty_message.DebugString()",
                 "all_types_message.DebugString()",&local_438,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&local_438);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_438);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = anon_var_dwarf_651463 + 5;
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                   ,0x1f8,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_438)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if ((long *)local_438._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_438._M_dataplus._M_p + 8))();
        }
      }
      this_00 = &gtest_ar.message_;
      goto LAB_007b8b54;
    }
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_438,(internal *)&gtest_ar_,
               (AssertionResult *)"empty_message.ParseFromString(bizarro_data)","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x1f6,local_438._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_450,(Message *)&gtest_ar);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_438,(internal *)&gtest_ar_,
               (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &all_types_message)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x1f5,local_438._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_450,(Message *)&gtest_ar);
  }
  this_00 = &gtest_ar_.message_;
  testing::internal::AssertHelper::~AssertHelper(&local_450);
  std::__cxx11::string::~string((string *)&local_438);
  if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
  }
LAB_007b8b54:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  io::CodedInputStream::~CodedInputStream(&input);
  std::__cxx11::string::~string((string *)&bizarro_data);
  internal::ZeroFieldsBase::~ZeroFieldsBase(&empty_message.super_ZeroFieldsBase);
  proto2_unittest::TestAllTypes::~TestAllTypes(&all_types_message);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, WrongTypeTreatedAsUnknownViaReflection) {
  // Same as WrongTypeTreatedAsUnknown but via the reflection interface.

  unittest::TestAllTypes all_types_message;
  unittest::TestEmptyMessage empty_message;
  std::string bizarro_data = GetBizarroData();
  io::ArrayInputStream raw_input(bizarro_data.data(), bizarro_data.size());
  io::CodedInputStream input(&raw_input);
  ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &all_types_message));
  ASSERT_TRUE(empty_message.ParseFromString(bizarro_data));

  EXPECT_EQ(empty_message.DebugString(), all_types_message.DebugString());
}